

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QWizardPage * __thiscall QMap<int,_QWizardPage_*>::take(QMap<int,_QWizardPage_*> *this,int *key)

{
  bool bVar1;
  mapped_type *ppQVar2;
  _Node_handle<int,_std::pair<const_int,_QWizardPage_*>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QWizardPage_*>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  node_type node;
  QMap<int,_QWizardPage_*> copy;
  QMap<int,_QWizardPage_*> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar3;
  mapped_type local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>_>
                      *)0x7c0a4f);
  if (bVar1) {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    bVar1 = QtPrivate::
            QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>_>
            ::isShared((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>_>
                        *)in_RDI);
    if (bVar1) {
      QMap((QMap<int,_QWizardPage_*> *)in_RDI,in_stack_ffffffffffffffa8);
    }
    else {
      memset(&local_10,0,8);
      QMap((QMap<int,_QWizardPage_*> *)0x7c0aa9);
    }
    detach((QMap<int,_QWizardPage_*> *)in_RDI);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>_>
                  *)0x7c0ae1);
    std::
    map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>::
    extract((map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>
             *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),(key_type *)in_RDI);
    bVar1 = std::_Node_handle_common::operator_cast_to_bool((_Node_handle_common *)&local_28);
    if (bVar1) {
      ppQVar2 = std::
                _Node_handle<int,_std::pair<const_int,_QWizardPage_*>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QWizardPage_*>_>_>_>
                ::mapped(in_RDI);
      local_30 = *ppQVar2;
    }
    uVar3 = (uint)bVar1;
    std::
    _Node_handle<int,_std::pair<const_int,_QWizardPage_*>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QWizardPage_*>_>_>_>
    ::~_Node_handle((_Node_handle<int,_std::pair<const_int,_QWizardPage_*>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QWizardPage_*>_>_>_>
                     *)0x7c0b35);
    if (uVar3 == 0) {
      local_30 = (mapped_type)0x0;
    }
    ~QMap((QMap<int,_QWizardPage_*> *)0x7c0b5a);
  }
  else {
    local_30 = (mapped_type)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

T take(const Key &key)
    {
        if (!d)
            return T();

        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. There is no need of copying all the
        // elements (the one to be removed can be skipped).
        detach();

#ifdef __cpp_lib_node_extract
        if (const auto node = d->m.extract(key))
            return std::move(node.mapped());
#else
        auto i = d->m.find(key);
        if (i != d->m.end()) {
            // ### breaks RVO on most compilers (but only on old-fashioned ones, so who cares?)
            T result(std::move(i->second));
            d->m.erase(i);
            return result;
        }
#endif
        return T();
    }